

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double-conversion.cc
# Opt level: O0

bool __thiscall
FIX::double_conversion::DoubleToStringConverter::ToPrecision
          (DoubleToStringConverter *this,double value,int precision,StringBuilder *result_builder)

{
  bool bVar1;
  int digits_after_point;
  int local_dc;
  int i;
  int extra_zero;
  int exponent;
  char local_c8 [3];
  bool unique_zero;
  int decimal_rep_length;
  char decimal_rep [121];
  bool local_3d;
  int kDecimalRepCapacity;
  bool sign;
  int decimal_point;
  StringBuilder *local_30;
  StringBuilder *result_builder_local;
  double dStack_20;
  int precision_local;
  double value_local;
  DoubleToStringConverter *this_local;
  
  local_30 = result_builder;
  result_builder_local._4_4_ = precision;
  dStack_20 = value;
  value_local = (double)this;
  Double::Double((Double *)&stack0xffffffffffffffc8,value);
  bVar1 = Double::IsSpecial((Double *)&stack0xffffffffffffffc8);
  if (bVar1) {
    this_local._7_1_ = HandleSpecialValues(this,dStack_20,local_30);
  }
  else if ((result_builder_local._4_4_ < 1) || (0x78 < result_builder_local._4_4_)) {
    this_local._7_1_ = false;
  }
  else {
    DoubleToAscii(dStack_20,PRECISION,result_builder_local._4_4_,local_c8,0x79,&local_3d,&exponent,
                  &kDecimalRepCapacity);
    if (result_builder_local._4_4_ < exponent) {
      __assert_fail("decimal_rep_length <= precision",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/marlowa[P]quickfix/src/C++/double-conversion/double-conversion.cc"
                    ,0x132,
                    "bool FIX::double_conversion::DoubleToStringConverter::ToPrecision(double, int, StringBuilder *) const"
                   );
    }
    if (((local_3d & 1U) != 0) &&
       (((dStack_20 != 0.0 || (NAN(dStack_20))) || ((this->flags_ & 8U) == 0)))) {
      StringBuilder::AddCharacter(local_30,'-');
    }
    if ((this->max_leading_padding_zeroes_in_precision_mode_ < 1 - kDecimalRepCapacity) ||
       (this->max_trailing_padding_zeroes_in_precision_mode_ <
        (int)((kDecimalRepCapacity - result_builder_local._4_4_) + (uint)((this->flags_ & 4U) != 0))
       )) {
      for (local_dc = exponent; local_dc < result_builder_local._4_4_; local_dc = local_dc + 1) {
        local_c8[local_dc] = '0';
      }
      CreateExponentialRepresentation
                (this,local_c8,result_builder_local._4_4_,kDecimalRepCapacity + -1,local_30);
    }
    else {
      digits_after_point = Max<int>(0,result_builder_local._4_4_ - kDecimalRepCapacity);
      CreateDecimalRepresentation
                (this,local_c8,exponent,kDecimalRepCapacity,digits_after_point,local_30);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool DoubleToStringConverter::ToPrecision(double value,
                                          int precision,
                                          StringBuilder* result_builder) const {
  if (Double(value).IsSpecial()) {
    return HandleSpecialValues(value, result_builder);
  }

  if (precision < kMinPrecisionDigits || precision > kMaxPrecisionDigits) {
    return false;
  }

  // Find a sufficiently precise decimal representation of n.
  int decimal_point;
  bool sign;
  // Add one for the terminating null character.
  const int kDecimalRepCapacity = kMaxPrecisionDigits + 1;
  char decimal_rep[kDecimalRepCapacity];
  int decimal_rep_length;

  DoubleToAscii(value, PRECISION, precision,
                decimal_rep, kDecimalRepCapacity,
                &sign, &decimal_rep_length, &decimal_point);
  ASSERT(decimal_rep_length <= precision);

  bool unique_zero = ((flags_ & UNIQUE_ZERO) != 0);
  if (sign && (value != 0.0 || !unique_zero)) {
    result_builder->AddCharacter('-');
  }

  // The exponent if we print the number as x.xxeyyy. That is with the
  // decimal point after the first digit.
  int exponent = decimal_point - 1;

  int extra_zero = ((flags_ & EMIT_TRAILING_ZERO_AFTER_POINT) != 0) ? 1 : 0;
  if ((-decimal_point + 1 > max_leading_padding_zeroes_in_precision_mode_) ||
      (decimal_point - precision + extra_zero >
       max_trailing_padding_zeroes_in_precision_mode_)) {
    // Fill buffer to contain 'precision' digits.
    // Usually the buffer is already at the correct length, but 'DoubleToAscii'
    // is allowed to return less characters.
    for (int i = decimal_rep_length; i < precision; ++i) {
      decimal_rep[i] = '0';
    }

    CreateExponentialRepresentation(decimal_rep,
                                    precision,
                                    exponent,
                                    result_builder);
  } else {
    CreateDecimalRepresentation(decimal_rep, decimal_rep_length, decimal_point,
                                Max(0, precision - decimal_point),
                                result_builder);
  }
  return true;
}